

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

counting_iterator __thiscall
fmt::v7::detail::float_writer<char>::prettify<fmt::v7::detail::counting_iterator>
          (float_writer<char> *this,counting_iterator it)

{
  counting_iterator cVar1;
  bool bVar2;
  char local_1d1;
  char local_1a9;
  float_writer<char> *local_1a8;
  size_t local_1a0;
  counting_iterator local_190;
  value_type local_185;
  int local_184;
  int local_180;
  int num_digits_1;
  int num_zeros_3;
  value_type local_16b;
  char local_16a [2];
  size_t local_168;
  int local_154;
  float_writer<char> *pfStack_150;
  int num_zeros_2;
  size_t local_148;
  counting_iterator local_138;
  value_type local_129;
  float_writer<char> *local_128;
  counting_iterator local_118;
  value_type local_10d;
  int local_10c;
  counting_iterator cStack_108;
  int num_digits;
  size_t local_100;
  char local_f1;
  float_writer<char> *local_f0;
  counting_iterator local_d8;
  value_type local_ca;
  char local_c9;
  int local_c8;
  int num_zeros_1;
  value_type local_b2;
  char local_b1;
  size_t local_b0;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  float_writer<char> *local_90;
  counting_iterator local_80;
  value_type local_73;
  char local_72 [2];
  size_t local_70;
  size_t local_68;
  float_writer<char> *local_60;
  size_t local_58;
  counting_iterator local_48;
  value_type local_39;
  int local_38;
  int num_zeros;
  value_type local_26;
  char local_25;
  int local_24;
  float_writer<char> *pfStack_20;
  int full_exp;
  float_writer<char> *this_local;
  counting_iterator it_local;
  
  local_24 = this->num_digits_ + this->exp_;
  pfStack_20 = this;
  this_local = (float_writer<char> *)it.count_;
  if ((char)*(undefined4 *)&(this->specs_).field_0x4 == '\x01') {
    local_25 = *this->digits_;
    _num_zeros = counting_iterator::operator++((counting_iterator *)&this_local,0);
    counting_iterator::operator*((counting_iterator *)&num_zeros);
    counting_iterator::value_type::operator=(&local_26,&local_25);
    local_38 = (this->specs_).precision - this->num_digits_;
    if ((1 < this->num_digits_) || ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0)) {
      local_48 = counting_iterator::operator++((counting_iterator *)&this_local,0);
      counting_iterator::operator*(&local_48);
      counting_iterator::value_type::operator=(&local_39,&this->decimal_point_);
    }
    local_60 = this_local;
    local_58 = (size_t)copy_str<char,_const_char_*,_fmt::v7::detail::counting_iterator,_0>
                                 (this->digits_ + 1,this->digits_ + this->num_digits_,
                                  (counting_iterator)this_local);
    this_local = (float_writer<char> *)local_58;
    if ((0 < local_38) && ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0)) {
      local_72[1] = 0x30;
      local_70 = local_58;
      local_68 = (size_t)std::fill_n<fmt::v7::detail::counting_iterator,int,char>
                                   ((counting_iterator)local_58,local_38,local_72 + 1);
      this_local = (float_writer<char> *)local_68;
    }
    local_1d1 = 'E';
    if ((*(uint *)&(this->specs_).field_0x4 & 0x10000) == 0) {
      local_1d1 = 'e';
    }
    local_72[0] = local_1d1;
    local_80 = counting_iterator::operator++((counting_iterator *)&this_local,0);
    counting_iterator::operator*(&local_80);
    counting_iterator::value_type::operator=(&local_73,local_72);
    local_90 = this_local;
    it_local = write_exponent<char,fmt::v7::detail::counting_iterator>
                         (local_24 + -1,(counting_iterator)this_local);
  }
  else {
    if (local_24 < this->num_digits_) {
      if (local_24 < 1) {
        local_16a[0] = '0';
        _num_zeros_3 = counting_iterator::operator++((counting_iterator *)&this_local,0);
        counting_iterator::operator*((counting_iterator *)&num_zeros_3);
        counting_iterator::value_type::operator=(&local_16b,local_16a);
        local_180 = -local_24;
        local_184 = this->num_digits_;
        if (((local_184 == 0) && (-1 < (this->specs_).precision)) &&
           ((this->specs_).precision < local_180)) {
          local_180 = (this->specs_).precision;
        }
        if ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) == 0) {
          while( true ) {
            bVar2 = false;
            if (0 < local_184) {
              bVar2 = this->digits_[local_184 + -1] == '0';
            }
            if (!bVar2) break;
            local_184 = local_184 + -1;
          }
        }
        if (((local_180 != 0) || (local_184 != 0)) ||
           ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0)) {
          local_190 = counting_iterator::operator++((counting_iterator *)&this_local,0);
          counting_iterator::operator*(&local_190);
          counting_iterator::value_type::operator=(&local_185,&this->decimal_point_);
          local_1a8 = this_local;
          local_1a9 = '0';
          local_1a0 = (size_t)std::fill_n<fmt::v7::detail::counting_iterator,int,char>
                                        ((counting_iterator)this_local,local_180,&local_1a9);
          this_local = (float_writer<char> *)local_1a0;
          this_local = (float_writer<char> *)
                       copy_str<char,_const_char_*,_fmt::v7::detail::counting_iterator,_0>
                                 (this->digits_,this->digits_ + local_184,
                                  (counting_iterator)local_1a0);
        }
      }
      else {
        cStack_108.count_ = it.count_;
        local_100 = (size_t)copy_str<char,_const_char_*,_fmt::v7::detail::counting_iterator,_0>
                                      (this->digits_,this->digits_ + local_24,it);
        this_local = (float_writer<char> *)local_100;
        if ((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) == 0) {
          local_10c = this->num_digits_;
          while( true ) {
            bVar2 = false;
            if (local_24 < local_10c) {
              bVar2 = this->digits_[local_10c + -1] == '0';
            }
            if (!bVar2) break;
            local_10c = local_10c + -1;
          }
          if (local_10c != local_24) {
            local_118 = counting_iterator::operator++((counting_iterator *)&this_local,0);
            counting_iterator::operator*(&local_118);
            counting_iterator::value_type::operator=(&local_10d,&this->decimal_point_);
          }
          local_128 = this_local;
          cVar1 = copy_str<char,_const_char_*,_fmt::v7::detail::counting_iterator,_0>
                            (this->digits_ + local_24,this->digits_ + local_10c,
                             (counting_iterator)this_local);
          return (counting_iterator)cVar1.count_;
        }
        local_138 = counting_iterator::operator++((counting_iterator *)&this_local,0);
        counting_iterator::operator*(&local_138);
        counting_iterator::value_type::operator=(&local_129,&this->decimal_point_);
        pfStack_150 = this_local;
        local_168 = (size_t)copy_str<char,_const_char_*,_fmt::v7::detail::counting_iterator,_0>
                                      (this->digits_ + local_24,this->digits_ + this->num_digits_,
                                       (counting_iterator)this_local);
        this_local = (float_writer<char> *)local_168;
        if (this->num_digits_ < (this->specs_).precision) {
          local_154 = (this->specs_).precision - this->num_digits_;
          local_16a[1] = 0x30;
          local_148 = local_168;
          this_local = (float_writer<char> *)
                       std::fill_n<fmt::v7::detail::counting_iterator,int,char>
                                 ((counting_iterator)local_168,local_154,local_16a + 1);
        }
      }
    }
    else {
      local_a0 = it.count_;
      local_b0 = (size_t)copy_str<char,_const_char_*,_fmt::v7::detail::counting_iterator,_0>
                                   (this->digits_,this->digits_ + this->num_digits_,it);
      local_b1 = '0';
      local_98 = local_b0;
      this_local = (float_writer<char> *)local_b0;
      local_a8 = (size_t)std::fill_n<fmt::v7::detail::counting_iterator,int,char>
                                   ((counting_iterator)local_b0,local_24 - this->num_digits_,
                                    &local_b1);
      this_local = (float_writer<char> *)local_a8;
      if (((*(uint *)&(this->specs_).field_0x4 >> 0x14 & 1) != 0) || ((this->specs_).precision < 0))
      {
        _num_zeros_1 = counting_iterator::operator++((counting_iterator *)&this_local,0);
        counting_iterator::operator*((counting_iterator *)&num_zeros_1);
        counting_iterator::value_type::operator=(&local_b2,&this->decimal_point_);
        local_c8 = (this->specs_).precision - local_24;
        if (local_c8 < 1) {
          if ((char)*(undefined4 *)&(this->specs_).field_0x4 != '\x02') {
            local_c9 = '0';
            local_d8 = counting_iterator::operator++((counting_iterator *)&this_local,0);
            counting_iterator::operator*(&local_d8);
            counting_iterator::value_type::operator=(&local_ca,&local_c9);
          }
          return (counting_iterator)(counting_iterator)this_local;
        }
        local_f0 = this_local;
        local_f1 = '0';
        this_local = (float_writer<char> *)
                     std::fill_n<fmt::v7::detail::counting_iterator,int,char>
                               ((counting_iterator)this_local,local_c8,&local_f1);
      }
    }
    it_local.count_ = (size_t)this_local;
  }
  return (counting_iterator)it_local.count_;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }